

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteReferences(FBXExporter *this)

{
  Node n;
  allocator local_b9;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_a8;
  Node local_88;
  
  if (this->binary == false) {
    std::__cxx11::string::string((string *)&local_88,"Document References",(allocator *)&local_a8);
    WriteAsciiSectionHeader(this,&local_88.name);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::string((string *)&local_a8,"References",&local_b9);
  FBX::Node::Node(&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_88.force_has_children = true;
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             &(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  FBX::Node::Dump(&local_88,(shared_ptr<Assimp::IOStream> *)&local_b8,this->binary,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  FBX::Node::~Node(&local_88);
  return;
}

Assistant:

void FBXExporter::WriteReferences ()
{
    if (!binary) {
        WriteAsciiSectionHeader("Document References");
    }
    // always empty for now.
    // not really sure what this is for.
    FBX::Node n("References");
    n.force_has_children = true;
    n.Dump(outfile, binary, 0);
}